

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::outmetrics(tetgenmesh *this,tetgenio *out)

{
  tetgenmesh *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  double *pdVar6;
  ulong uVar7;
  int *piVar8;
  tetrahedron ppdVar9;
  int local_464;
  undefined1 local_458 [8];
  triface parenttet;
  int pointindex;
  int firstindex;
  int msize;
  int i;
  int mtrindex;
  point ptloop;
  char outmtrfilename [1024];
  FILE *local_20;
  FILE *outfile;
  tetgenio *out_local;
  tetgenmesh *this_local;
  
  local_20 = (FILE *)0x0;
  msize = 0;
  uVar4 = this->sizeoftensor - this->useinsertradius;
  if (uVar4 != 0) {
    if (out == (tetgenio *)0x0) {
      strcpy((char *)&ptloop,this->b->outfilename);
      strcat((char *)&ptloop,".mtr");
    }
    if (this->b->quiet == 0) {
      if (out == (tetgenio *)0x0) {
        printf("Writing %s.\n",&ptloop);
      }
      else {
        printf("Writing metrics.\n");
      }
    }
    if (out == (tetgenio *)0x0) {
      local_20 = fopen((char *)&ptloop,"w");
      if (local_20 == (FILE *)0x0) {
        printf("File I/O Error:  Cannot create file %s.\n",&ptloop);
        terminatetetgen(this,3);
      }
      fprintf(local_20,"%ld  %d\n",this->points->items,(ulong)uVar4);
    }
    else {
      out->numberofpointmtrs = uVar4;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = this->points->items * (long)(int)uVar4;
      uVar7 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      pdVar6 = (double *)operator_new__(uVar7);
      out->pointmtrlist = pdVar6;
      if (out->pointmtrlist == (double *)0x0) {
        terminatetetgen(this,1);
      }
    }
    memorypool::traversalinit(this->points);
    _i = pointtraverse(this);
    while (_i != (point)0x0) {
      if (out == (tetgenio *)0x0) {
        for (firstindex = 0; firstindex < (int)uVar4; firstindex = firstindex + 1) {
          fprintf(local_20," %-16.8e",_i[this->pointmtrindex + firstindex]);
        }
        fprintf(local_20,"\n");
      }
      else {
        for (firstindex = 0; firstindex < (int)uVar4; firstindex = firstindex + 1) {
          out->pointmtrlist[msize] = _i[this->pointmtrindex + firstindex];
          msize = msize + 1;
        }
      }
      _i = pointtraverse(this);
    }
    if (out == (tetgenio *)0x0) {
      strcpy((char *)&ptloop,this->b->outfilename);
      strcat((char *)&ptloop,".p2t");
    }
    if (this->b->quiet == 0) {
      if (out == (tetgenio *)0x0) {
        printf("Writing %s.\n",&ptloop);
      }
      else {
        printf("Writing point-to-tet map.\n");
      }
    }
    if (out == (tetgenio *)0x0) {
      local_20 = fopen((char *)&ptloop,"w");
      if (local_20 == (FILE *)0x0) {
        printf("File I/O Error:  Cannot create file %s.\n",&ptloop);
        terminatetetgen(this,3);
      }
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = this->points->items;
      uVar7 = SUB168(auVar2 * ZEXT816(4),0);
      if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      piVar8 = (int *)operator_new__(uVar7);
      out->point2tetlist = piVar8;
      if (out->point2tetlist == (int *)0x0) {
        terminatetetgen(this,1);
      }
    }
    if (this->bgm != (tetgenmesh *)0x0) {
      indexelements(this->bgm);
    }
    if (this->b->zeroindex == 0) {
      local_464 = this->in->firstnumber;
    }
    else {
      local_464 = 0;
    }
    parenttet._12_4_ = local_464;
    firstindex = 0;
    triface::triface((triface *)local_458);
    memorypool::traversalinit(this->points);
    _i = pointtraverse(this);
    while (_i != (point)0x0) {
      if (this->bgm == (tetgenmesh *)0x0) {
        ppdVar9 = point2tet(this,_i);
        decode(this,ppdVar9,(triface *)local_458);
      }
      else {
        this_00 = this->bgm;
        ppdVar9 = point2bgmtet(this,_i);
        decode(this_00,ppdVar9,(triface *)local_458);
      }
      uVar3 = parenttet._12_4_;
      if (out == (tetgenio *)0x0) {
        uVar4 = elemindex(this,(tetrahedron *)local_458);
        fprintf(local_20,"%d  %d\n",(ulong)(uint)uVar3,(ulong)uVar4);
      }
      else {
        iVar5 = elemindex(this,(tetrahedron *)local_458);
        out->point2tetlist[firstindex] = iVar5;
      }
      parenttet._12_4_ = parenttet._12_4_ + 1;
      firstindex = firstindex + 1;
      _i = pointtraverse(this);
    }
    if (out == (tetgenio *)0x0) {
      fprintf(local_20,"# Generated by %s\n",this->b->commandline);
      fclose(local_20);
    }
  }
  return;
}

Assistant:

void tetgenmesh::outmetrics(tetgenio* out)
{
  FILE *outfile = NULL;
  char outmtrfilename[FILENAMESIZE];
  point ptloop;
  int mtrindex = 0;
  int i;
  int msize = (sizeoftensor - useinsertradius);
  if (msize == 0) {
    return;
  }

  if (out == (tetgenio *) NULL) {
    strcpy(outmtrfilename, b->outfilename);
    strcat(outmtrfilename, ".mtr");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", outmtrfilename);
    } else {
      printf("Writing metrics.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(outmtrfilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", outmtrfilename);
      terminatetetgen(this, 3);
    }
    // Number of points, number of point metrices,
    fprintf(outfile, "%ld  %d\n", points->items, msize);
  } else {
    // Allocate space for 'pointmtrlist'.
    out->numberofpointmtrs = msize; 
    out->pointmtrlist = new REAL[points->items * msize];
    if (out->pointmtrlist == (REAL *) NULL) {
      terminatetetgen(this, 1);
    }
  }

  points->traversalinit();
  ptloop = pointtraverse();
  while (ptloop != (point) NULL) {
    if (out == (tetgenio *) NULL) {
      for (i = 0; i < msize; i++) {
        fprintf(outfile, " %-16.8e", ptloop[pointmtrindex + i]);
      }
      fprintf(outfile, "\n");
    } else {
      for (i = 0; i < msize; i++) {
        out->pointmtrlist[mtrindex++] = ptloop[pointmtrindex + i];
      }
    }
    ptloop = pointtraverse();
  }

  // Output the point-to-tet map.
  if (out == (tetgenio *) NULL) {
    strcpy(outmtrfilename, b->outfilename);
    strcat(outmtrfilename, ".p2t");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", outmtrfilename);
    } else {
      printf("Writing point-to-tet map.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(outmtrfilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", outmtrfilename);
      terminatetetgen(this, 3);
    }
    // Number of points,
    //fprintf(outfile, "%ld\n", points->items);
  } else {
    // Allocate space for 'point2tetlist'.
    out->point2tetlist = new int[points->items];
    if (out->point2tetlist == (int *) NULL) {
      terminatetetgen(this, 1);
    }
  }

  // The list of tetrahedra must be indexed.
  if (bgm != NULL) {
    bgm->indexelements();
  }
  // Determine the first index (0 or 1).
  int firstindex = b->zeroindex ? 0 : in->firstnumber;
  int pointindex = firstindex;
  i = 0;

  triface parenttet;
  points->traversalinit();
  ptloop = pointtraverse();
  while (ptloop != (point) NULL) {
    if (bgm != NULL) {
	  bgm->decode(point2bgmtet(ptloop), parenttet);
	} else {
	  decode(point2tet(ptloop), parenttet);
	}
    if (out == (tetgenio *) NULL) {
      fprintf(outfile, "%d  %d\n", pointindex, elemindex(parenttet.tet));
    } else {
      out->point2tetlist[i] = elemindex(parenttet.tet);
    }
	pointindex++;
	i++;
    ptloop = pointtraverse();
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}